

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PartsBupOutputter.cpp
# Opt level: O0

ssize_t __thiscall PartsBupOutputter::write(PartsBupOutputter *this,int __fd,void *__buf,size_t __n)

{
  ulong uVar1;
  ostream *poVar2;
  anon_class_8_1_8991fb9c path;
  anon_class_8_1_ba1d3da0 addColor;
  ImageEntry *cur;
  value_type *in_stack_fffffffffffffe98;
  pair<Point,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffea0;
  pair<Point,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  string local_110 [16];
  string *in_stack_ffffffffffffff00;
  anon_class_8_1_8991fb9c *in_stack_ffffffffffffff08;
  string local_c8 [88];
  string local_70 [32];
  undefined4 local_50;
  undefined4 local_4c;
  PartsBupOutputter *local_20;
  anon_class_8_1_ba1d3da0 local_18;
  pair<Point,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_10;
  PartsBupOutputter *local_8;
  
  local_8 = this;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<PartsBupOutputter::ImageEntry,_std::allocator<PartsBupOutputter::ImageEntry>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<PartsBupOutputter::ImageEntry,_std::allocator<PartsBupOutputter::ImageEntry>_>_>_>_>
  ::back((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<PartsBupOutputter::ImageEntry,_std::allocator<PartsBupOutputter::ImageEntry>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<PartsBupOutputter::ImageEntry,_std::allocator<PartsBupOutputter::ImageEntry>_>_>_>_>
          *)in_stack_fffffffffffffea0);
  std::vector<PartsBupOutputter::ImageEntry,_std::allocator<PartsBupOutputter::ImageEntry>_>::
  emplace_back<>((vector<PartsBupOutputter::ImageEntry,_std::allocator<PartsBupOutputter::ImageEntry>_>
                  *)in_stack_fffffffffffffea0);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<PartsBupOutputter::ImageEntry,_std::allocator<PartsBupOutputter::ImageEntry>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<PartsBupOutputter::ImageEntry,_std::allocator<PartsBupOutputter::ImageEntry>_>_>_>_>
  ::back((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<PartsBupOutputter::ImageEntry,_std::allocator<PartsBupOutputter::ImageEntry>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<PartsBupOutputter::ImageEntry,_std::allocator<PartsBupOutputter::ImageEntry>_>_>_>_>
          *)in_stack_fffffffffffffea0);
  local_18.cur = std::
                 vector<PartsBupOutputter::ImageEntry,_std::allocator<PartsBupOutputter::ImageEntry>_>
                 ::back((vector<PartsBupOutputter::ImageEntry,_std::allocator<PartsBupOutputter::ImageEntry>_>
                         *)in_stack_fffffffffffffea0);
  local_50 = 0;
  local_4c = 0;
  local_20 = this;
  local_10 = (pair<Point,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_18.cur;
  write::anon_class_8_1_8991fb9c::operator()(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
  std::pair<Point,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (in_stack_fffffffffffffea0,&in_stack_fffffffffffffe98->first,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x12964f);
  std::
  vector<std::pair<Point,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<Point,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::push_back((vector<std::pair<Point,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<Point,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  std::pair<Point,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~pair((pair<Point,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)0x129672);
  std::__cxx11::string::~string(local_70);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    write::anon_class_8_1_8991fb9c::operator()(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
    std::
    pair<Point,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    pair<Point_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (in_stack_fffffffffffffea0,&in_stack_fffffffffffffe98->first,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1296ea);
    std::
    vector<std::pair<Point,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<Point,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::push_back((vector<std::pair<Point,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<Point,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    std::
    pair<Point,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~pair((pair<Point,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)0x12970d);
    std::__cxx11::string::~string(local_c8);
    write::anon_class_8_1_ba1d3da0::operator()(&local_18,this->faceBlend);
  }
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    this_00 = local_10;
    write::anon_class_8_1_8991fb9c::operator()(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
    std::
    pair<Point,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    pair<Point_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (this_00,&in_stack_fffffffffffffe98->first,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x129834);
    std::
    vector<std::pair<Point,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<Point,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::push_back((vector<std::pair<Point,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<Point,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)this_00,in_stack_fffffffffffffe98);
    std::
    pair<Point,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    ~pair((pair<Point,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)0x129851);
    std::__cxx11::string::~string(local_110);
    write::anon_class_8_1_ba1d3da0::operator()(&local_18,this->mouthBlend);
  }
  if (*(int *)&(local_10->second).field_2 == 2) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Warning: ");
    poVar2 = std::operator<<(poVar2,(string *)&this->withFaceName);
    poVar2 = std::operator<<(poVar2,
                             " has fully transparent overridden pixels, it may not be properly renderable"
                            );
    local_10 = (pair<Point,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  return (ssize_t)local_10;
}

Assistant:

void write() override {
		expressions.back().second.emplace_back();
		ImageEntry& cur = expressions.back().second.back();

		auto addColor = [&](Blend type){
			if (cur.color == Blend::AlphaBlend) {
				cur.color = type;
			} else if (type == Blend::NotPossible) {
				cur.color = type;
			}
		};
		auto path = [&](const std::string& name){
			return baseName + "/" + name + ".png";
		};

		cur.parts.push_back({{0, 0}, path(baseName)});
		if (!withFaceName.empty()) {
			cur.parts.push_back({facePos, path(withFaceName)});
			addColor(faceBlend);
		}
		if (!withMouthName.empty()) {
			cur.parts.push_back({mouthPos, path(withMouthName)});
			addColor(mouthBlend);
		}
		if (cur.color == Blend::NotPossible) {
			std::cerr << "Warning: " << withFaceName << " has fully transparent overridden pixels, it may not be properly renderable" << std::endl;
		}
	}